

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr * __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
ReadNumericExpr_abi_cxx11_
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
           *this,int opcode)

{
  int in_EDX;
  undefined8 *in_RSI;
  NumericExpr *in_RDI;
  SymbolicArgHandler args_4;
  int num_args_3;
  NumberOfArgHandler args_3;
  int num_args_2;
  NumericArgHandler args_2;
  int num_args_1;
  VarArgHandler args_1;
  int num_args;
  int i;
  PLTermHandler pl_handler;
  int num_slopes;
  NumericExpr else_expr;
  NumericExpr then_expr;
  LogicalExpr condition;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::NumericExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  NumericArgHandler *in_stack_fffffffffffffcc8;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::NumericExprReader>
  *in_stack_fffffffffffffcd0;
  Expr *arg0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int num_args_00;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
  *in_stack_fffffffffffffce0;
  bool ignore_zero;
  NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::NumericExprReader>
  *in_stack_fffffffffffffcf0;
  ExprPrinter *in_stack_fffffffffffffcf8;
  CStringRef in_stack_fffffffffffffd00;
  Kind kind_00;
  undefined8 uVar1;
  ExprPrinter *in_stack_fffffffffffffd08;
  string *psVar2;
  ArgHandler *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  int num_args_01;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
  *in_stack_fffffffffffffd20;
  BasicCStringRef<char> local_290 [2];
  string local_280 [40];
  int local_258;
  string local_250 [36];
  int local_22c;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
  *in_stack_fffffffffffffde8;
  string local_1d8 [40];
  int local_1b0;
  BasicCStringRef<char> local_1a8;
  int local_19c;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [36];
  Kind local_24;
  OpCodeInfo *local_20;
  
  num_args_01 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  local_20 = GetOpCodeInfo(in_EDX);
  local_24 = local_20->kind;
  switch(local_20->first_kind) {
  case FIRST_UNARY:
    ReadNumericExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    ExprPrinter::OnUnary
              (in_stack_fffffffffffffcf8,(Kind)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
               (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::__cxx11::string::~string(local_48);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef(local_290,"expected numeric expression opcode");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
    std::__cxx11::string::string((string *)in_RDI);
    break;
  case ADD:
    psVar2 = local_98;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::NumericExprReader>
    ::BinaryArgReader(in_stack_fffffffffffffcf0,
                      (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                       *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    kind_00 = (Kind)((ulong)in_stack_fffffffffffffd00.data_ >> 0x20);
    std::__cxx11::string::string(local_b8,psVar2);
    std::__cxx11::string::string(local_d8,local_78);
    ExprPrinter::OnBinary
              (in_stack_fffffffffffffd08,kind_00,(string *)in_stack_fffffffffffffcf8,
               &in_stack_fffffffffffffcf0->lhs);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b8);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::NumericExprReader>
    ::~BinaryArgReader(in_stack_fffffffffffffcd0);
    break;
  case IF:
    ReadLogicalExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)in_stack_fffffffffffffd08);
    ignore_zero = SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0);
    ReadNumericExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),ignore_zero);
    ReadNumericExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),ignore_zero);
    std::__cxx11::string::string(local_158,local_f8);
    std::__cxx11::string::string(local_178,local_118);
    std::__cxx11::string::string(local_198,local_138);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnIf((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffd08,(LogicalExpr *)in_stack_fffffffffffffd00.data_,
           (NumericExpr *)in_stack_fffffffffffffcf8,&in_stack_fffffffffffffcf0->lhs);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f8);
    break;
  case PLTERM:
    local_19c = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                          ((BinaryReader<mp::internal::EndiannessConverter> *)
                           in_stack_fffffffffffffce0);
    if (local_19c < 2) {
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_1a8,"too few slopes in piecewise-linear term");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
    }
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RSI);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginPLTerm((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    for (local_1b0 = 0; local_1b0 < local_19c + -1; local_1b0 = local_1b0 + 1) {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
      ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                    *)in_stack_fffffffffffffcd0);
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::PLTermHandler::AddSlope
                ((PLTermHandler *)in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8);
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
      ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                    *)in_stack_fffffffffffffcd0);
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::PLTermHandler::AddBreakpoint
                ((PLTermHandler *)in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8);
    }
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                  *)in_stack_fffffffffffffcd0);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::PLTermHandler::AddSlope
              ((PLTermHandler *)in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8);
    uVar1 = in_RSI[2];
    psVar2 = local_1d8;
    ReadReference_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndPLTerm((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_RDI,uVar1,psVar2);
    std::__cxx11::string::~string(local_1d8);
    break;
  case FIRST_ITERATED:
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    ReadNumArgs(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginVarArg((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffcd0,(Kind)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                  (int)in_stack_fffffffffffffcc8);
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
               (ArgHandler *)in_stack_fffffffffffffcd0);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndVarArg((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_RDI,in_RSI[2]);
    break;
  case SUM:
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    ReadNumArgs(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    ExprPrinter::BeginSum
              ((ExprPrinter *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::NumericExprReader,ExprPrinter::NumericArgHandler>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
               (NumericArgHandler *)in_stack_fffffffffffffcd0);
    ExprPrinter::NumericArgHandler::NumericArgHandler
              ((NumericArgHandler *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    ExprPrinter::EndSum_abi_cxx11_
              ((ExprPrinter *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (NumericArgHandler *)in_stack_fffffffffffffcd0);
    ExprPrinter::NumericArgHandler::~NumericArgHandler((NumericArgHandler *)0x163a61);
    ExprPrinter::NumericArgHandler::~NumericArgHandler((NumericArgHandler *)0x163a6e);
    break;
  case LAST_ITERATED:
    local_22c = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                ::ReadNumArgs(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RSI);
    this_00 = (NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RSI[2];
    ReadNumericExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)CONCAT44(local_22c,in_stack_fffffffffffffce8),SUB81((ulong)this_00 >> 0x38,0));
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginNumberOf(this_00,in_stack_fffffffffffffcdc,&in_stack_fffffffffffffcd0->lhs);
    std::__cxx11::string::~string(local_250);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (in_stack_fffffffffffffd20,num_args_01,in_stack_fffffffffffffd10);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndNumberOf((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_RDI,in_RSI[2]);
    break;
  case NUMBEROF_SYM:
    local_258 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                ::ReadNumArgs(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RSI);
    arg0 = (Expr *)in_RSI[2];
    num_args_00 = local_258;
    ReadSymbolicExpr_abi_cxx11_(in_stack_fffffffffffffde8);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginSymbolicNumberOf
              ((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffce0,num_args_00,arg0);
    std::__cxx11::string::~string(local_280);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (in_stack_fffffffffffffd20,num_args_01,in_stack_fffffffffffffd10);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndSymbolicNumberOf
              ((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_RSI[2]);
    break;
  case COUNT:
    ReadCountExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  return in_RDI;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}